

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O3

void __thiscall
htmlcxx2::HTML::ParserSax::parseTag<char_const*>(ParserSax *this,char *begin,char *pos)

{
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  char *pcVar11;
  long lVar12;
  string name;
  string text;
  Node node;
  string local_168;
  char *local_148;
  char *local_140;
  char *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  string local_120;
  string local_100;
  Node local_e0;
  
  pbVar1 = (byte *)(begin + 1);
  cVar3 = begin[1];
  pbVar2 = (byte *)(begin + 2);
  local_148 = begin;
  pbVar10 = pbVar1;
  pbVar9 = pbVar1;
  if (cVar3 == '/') {
    pbVar1 = pbVar2;
    pbVar10 = pbVar2;
    pbVar9 = pbVar2;
  }
  while ((pbVar1 != (byte *)pos && (iVar7 = isalnum((uint)*pbVar1), pbVar10 = pbVar1, iVar7 != 0)))
  {
    pbVar1 = pbVar1 + 1;
    pbVar10 = (byte *)pos;
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_140 = pos;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,pbVar9,pbVar10);
  if (cVar3 != '/') {
    local_128 = local_168._M_string_length;
    local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p;
    local_138 = local_168._M_dataplus._M_p + 1;
    lVar12 = 0;
    do {
      if (local_128 == (long)(char)(&impl::LITERAL_MODE_ELEM)[lVar12 * 0xb]) {
        cVar4 = local_130->_M_local_buf[0];
        pcVar11 = "script" + lVar12 * 0xb;
        pcVar6 = local_138;
        while (cVar4 != '\0') {
          cVar5 = *pcVar11;
          if (cVar5 == '\0') goto LAB_0015678e;
          iVar7 = tolower((int)cVar4);
          iVar8 = tolower((int)cVar5);
          if ((char)iVar8 != (char)iVar7) goto LAB_0015678e;
          pcVar11 = pcVar11 + 1;
          cVar4 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        }
        if (*pcVar11 == '\0') {
          this->literal_ = "script" + lVar12 * 0xb;
          break;
        }
      }
LAB_0015678e:
      lVar12 = lVar12 + 1;
    } while (lVar12 != 5);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,local_148,local_140);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  Node::Node(&local_e0,&local_168,&local_100,&local_120,this->currentOffset_,
             local_100._M_string_length,NODE_TAG);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  this->currentOffset_ = this->currentOffset_ + local_e0.length_;
  (*this->_vptr_ParserSax[3])(this,&local_e0,(ulong)(cVar3 == '/'));
  Node::~Node(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParserSax::parseTag(It begin, It pos)
{
    It name_begin(begin);
    ++name_begin;
    bool isClosingTag = (*name_begin == '/');
    if (isClosingTag)
        ++name_begin;
    It name_end(name_begin);
    while ((name_end != pos) && ::isalnum((unsigned char)*name_end))
        ++name_end;
    std::string name(name_begin, name_end);

    if (!isClosingTag)
    {
        const size_t arrCount = sizeof(impl::LITERAL_MODE_ELEM) /
                sizeof(impl::LITERAL_MODE_ELEM[0]);
        const size_t tagLen = name.length();
        for (size_t i = 0; i < arrCount; ++i)
            if ((tagLen == static_cast<size_t>(impl::LITERAL_MODE_ELEM[i][0]))
                    && (impl::icompare(name.c_str(), &impl::LITERAL_MODE_ELEM[i][1]) == 0))
                {
                    literal_ = &impl::LITERAL_MODE_ELEM[i][1];
                    break;
                }
    }

    //by now, length is just the size of the tag
    std::string text(begin, pos);
    Node node(name, text, "", currentOffset_, text.length(), Node::NODE_TAG);
    currentOffset_ += node.length();
    onFoundTag(node, isClosingTag);
}